

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O3

void __thiscall OptionParser_LongFlag_Test::TestBody(OptionParser_LongFlag_Test *this)

{
  bool bVar1;
  char *message;
  bool flag;
  AssertionResult gtest_ar;
  char *args [2];
  OptionParser parser;
  bool local_e9;
  Message local_e8;
  internal local_e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  AssertHelper local_d0;
  undefined1 local_c8 [16];
  _Manager_type local_b8;
  code *local_b0;
  OptionParser local_a8;
  
  local_e9 = false;
  wabt::OptionParser::OptionParser(&local_a8,"prog","desc");
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc:28:36)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc:28:36)>
             ::_M_manager;
  local_c8._0_8_ = &local_e9;
  wabt::OptionParser::AddOption(&local_a8,"flag","help",(NullCallback *)local_c8);
  if (local_b8 != (_Manager_type)0x0) {
    (*local_b8)((_Any_data *)local_c8,(_Any_data *)local_c8,__destroy_functor);
  }
  local_c8._0_8_ = "prog name";
  local_c8._8_8_ = "--flag";
  wabt::OptionParser::Parse(&local_a8,2,(char **)local_c8);
  local_e8.ss_.ptr_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>(local_e0,"true","flag",(bool *)&local_e8,&local_e9);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message(&local_e8);
    if (local_d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (CONCAT71(local_e8.ss_.ptr_._1_7_,local_e8.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_e8.ss_.ptr_._1_7_,local_e8.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_e8.ss_.ptr_._1_7_,local_e8.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_a8.on_error_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.on_error_.super__Function_base._M_manager)
              ((_Any_data *)&local_a8.on_error_,(_Any_data *)&local_a8.on_error_,__destroy_functor);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            (&local_a8.arguments_);
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            (&local_a8.options_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.description_._M_dataplus._M_p != &local_a8.description_.field_2) {
    operator_delete(local_a8.description_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.program_name_._M_dataplus._M_p != &local_a8.program_name_.field_2) {
    operator_delete(local_a8.program_name_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(OptionParser, LongFlag) {
  bool flag = false;
  OptionParser parser("prog", "desc");
  parser.AddOption("flag", "help", [&]() { flag = true; });
  const char* args[] = {"prog name", "--flag"};
  parser.Parse(2, const_cast<char**>(args));
  EXPECT_EQ(true, flag);
}